

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int cvsrch(custom_function *funcpt,custom_gradient *funcgrad,double *x,double *f,double *g,
          double *stp,double *s,int N,double *dx,double maxstep,int MAXITER,double eps2,double ftol,
          double gtol,double xtol)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *__format;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_180;
  double dgm;
  double fm;
  double local_168;
  double local_160;
  double local_158;
  undefined8 uStack_150;
  double local_140;
  double local_138;
  double dgxm;
  double dgym;
  double fxm;
  double fym;
  double local_110;
  double local_108;
  undefined8 uStack_100;
  int local_ec;
  double local_e8;
  double dgx;
  double dgy;
  double fx;
  double fy;
  void *local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined8 uStack_90;
  ulong local_88;
  double local_80;
  double local_78;
  double local_70;
  double sty;
  double *local_60;
  double local_58;
  double stx;
  ulong local_48;
  int local_40;
  int local_3c;
  int brackt;
  
  uVar5 = (ulong)N;
  fm = (double)funcgrad;
  local_160 = eps2;
  fym = (double)funcpt;
  fy = maxstep;
  local_a8 = xtol;
  local_a0 = gtol;
  local_80 = ftol;
  stx = (double)f;
  local_60 = (double *)malloc(uVar5 * 8);
  local_c0 = malloc(uVar5 * 8);
  iVar1 = 0;
  iVar3 = 0;
  local_48 = uVar5;
  if ((((0 < (long)uVar5) && (dVar7 = 0.0, 0.0 <= local_a8)) && (iVar3 = iVar1, 0.0 <= local_a0)) &&
     ((0.0 <= local_80 && (0.0 < *stp)))) {
    uVar5 = 0;
    do {
      dVar7 = dVar7 + dx[uVar5] * s[uVar5] * dx[uVar5] * s[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)N != uVar5);
    if (dVar7 < 0.0) {
      sqrt(dVar7);
    }
    uVar5 = 1;
    if (1 < (int)local_48) {
      uVar5 = local_48 & 0xffffffff;
    }
    uVar4 = 0;
    do {
      dVar7 = ABS(x[uVar4]);
      if (ABS(x[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
        dVar7 = 1.0 / ABS(dx[uVar4]);
      }
      local_60[uVar4] = s[uVar4] / dVar7;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    local_b8 = array_max_abs(local_60,(int)local_48);
    local_b8 = local_80 / local_b8;
    dVar7 = 0.0;
    uVar4 = 0;
    do {
      dVar7 = dVar7 + g[uVar4] * s[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
    iVar3 = 0;
    if (dVar7 < 0.0) {
      local_40 = 0;
      local_110 = *(double *)stx;
      local_158 = dVar7 * local_80;
      uStack_150 = 0;
      local_78 = fy - local_b8;
      local_b0 = local_78 + local_78;
      uVar5 = 1;
      if (1 < (int)local_48) {
        uVar5 = local_48 & 0xffffffff;
      }
      memcpy(local_c0,x,uVar5 * 8);
      local_58 = 0.0;
      dgy = local_110;
      local_88 = 0;
      local_70 = 0.0;
      fx = local_110;
      local_ec = MAXITER + -1;
      dVar9 = -dVar7 * local_a0;
      local_98 = (double)CONCAT44(local_98._4_4_,1);
      local_108 = (double)CONCAT44(local_108._4_4_,1);
      dVar8 = local_78;
      local_e8 = dVar7;
      dgx = dVar7;
      do {
        local_3c = local_40;
        sty = local_58;
        local_78 = dVar8;
        if (local_40 == 1) {
          _brackt = local_70;
          local_168 = pmin(local_58,local_70);
          _brackt = pmax(sty,_brackt);
          sty = local_168;
        }
        else {
          _brackt = (*stp - local_58) * 4.0 + *stp;
        }
        dVar8 = pmax(*stp,local_b8);
        *stp = dVar8;
        dVar8 = pmin(dVar8,fy);
        *stp = dVar8;
        if ((((local_3c == 1) && ((dVar8 <= sty || (_brackt <= dVar8)))) ||
            (local_ec <= (int)local_88)) ||
           ((local_98._0_4_ == 0 || ((local_3c == 1 && (_brackt - sty <= _brackt * local_a8)))))) {
          *stp = local_58;
        }
        uVar4 = 0;
        do {
          x[uVar4] = *stp * s[uVar4] + *(double *)((long)local_c0 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        dVar8 = (double)(**(code **)fym)(x,local_48,*(undefined8 *)((long)fym + 8));
        *(double *)stx = dVar8;
        if (1.79769313486232e+308 <= ABS(dVar8)) {
          __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0014300d:
          printf(__format);
          iVar3 = 0xf;
          break;
        }
        if (NAN(dVar8)) {
          __format = "Program Exiting as the function returns NaN";
          goto LAB_0014300d;
        }
        if (fm == 0.0) {
          grad_calc2((custom_function *)fym,x,(int)local_48,dx,local_160,g);
        }
        else {
          (**(code **)fm)(x,local_48,g,*(undefined8 *)((long)fm + 8));
        }
        uVar2 = (int)local_88 + 1;
        local_88 = (ulong)uVar2;
        local_140 = 0.0;
        uVar4 = 0;
        do {
          local_140 = local_140 + g[uVar4] * s[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
        dVar8 = *stp;
        if (((local_3c == 1) && ((dVar8 <= sty || (_brackt <= dVar8)))) || (local_98._0_4_ == 0)) {
          iVar3 = 6;
        }
        else {
          iVar3 = 0;
        }
        dVar10 = dVar8 * local_158 + local_110;
        if (((dVar8 == fy) && (!NAN(dVar8) && !NAN(fy))) &&
           (*(double *)stx <= dVar10 && local_140 <= local_158)) {
          iVar3 = 5;
        }
        if (((dVar8 == local_b8) && (!NAN(dVar8) && !NAN(local_b8))) &&
           (local_158 <= local_140 || dVar10 < *(double *)stx)) {
          iVar3 = 4;
        }
        if (MAXITER <= (int)uVar2) {
          iVar3 = 3;
        }
        if ((local_3c == 1) && (_brackt - sty <= _brackt * local_a8)) {
          iVar3 = 2;
        }
        uStack_90 = 0;
        if (*(double *)stx <= dVar10 && ABS(local_140) <= dVar9) {
          iVar3 = 1;
        }
        bVar6 = local_108._0_4_ == 1;
        uVar2 = (uint)bVar6;
        local_98 = local_140;
        local_3c = iVar3;
        if ((bVar6) && (*(double *)stx <= dVar10)) {
          uStack_100 = 0;
          local_108 = dVar10;
          dVar8 = pmin(local_80,local_a0);
          bVar6 = local_98 < dVar8 * dVar7;
          uVar2 = (uint)bVar6;
          dVar10 = local_108;
        }
        local_108 = (double)CONCAT44(local_108._4_4_,uVar2);
        if (((!bVar6) || (dVar8 = *(double *)stx, dgy < dVar8)) || (dVar8 <= dVar10)) {
          iVar3 = cstep(&local_58,&dgy,&local_e8,&local_70,&fx,&dgx,stp,(double *)stx,&local_140,
                        &local_40,sty,_brackt);
          local_98 = (double)CONCAT44(local_98._4_4_,iVar3);
        }
        else {
          dgm = dVar8 - *stp * local_158;
          dgym = dgy - local_58 * local_158;
          fxm = fx - local_70 * local_158;
          local_180 = local_98 - local_158;
          local_138 = local_e8 - local_158;
          dgxm = dgx - local_158;
          iVar3 = cstep(&local_58,&dgym,&local_138,&local_70,&fxm,&dgxm,stp,&dgm,&local_180,
                        &local_40,sty,_brackt);
          local_98 = (double)CONCAT44(local_98._4_4_,iVar3);
          dgy = local_58 * local_158 + dgym;
          fx = local_70 * local_158 + fxm;
          local_e8 = local_138 + local_158;
          dgx = dgxm + local_158;
        }
        dVar8 = local_78;
        if (local_40 == 1) {
          dVar8 = ABS(local_70 - local_58);
          dVar10 = local_b0 * 0.66;
          local_b0 = local_78;
          if (dVar10 <= dVar8) {
            *stp = (local_70 - local_58) * 0.5 + local_58;
          }
        }
        iVar3 = local_3c;
      } while (local_3c == 0);
    }
  }
  free(local_60);
  free(local_c0);
  return iVar3;
}

Assistant:

int cvsrch(custom_function *funcpt, custom_gradient *funcgrad, double *x, double *f, double *g, double *stp, double *s, int N, double *dx, double maxstep,
	int MAXITER,double eps2,double ftol, double gtol, double xtol) {
	int info,i,siter,nfev;
	int infoc, j, brackt, stage1;
	double dg, dgm, dginit, dgtest, dgx, dgxm, dgy, dgym, finit, ftest1, fm, fx, fxm, fy, fym, p5, p66, stx, sty,
		stmin, stmax, width, width1, xtrapf;
	double nlen,den,rell,stepmin;
	double *rcheck,*wa;

	rcheck = (double*)malloc(sizeof(double)*N);
	wa = (double*)malloc(sizeof(double)*N);

	nlen = 0.0;
	p5 = 0.5;
	p66 = 0.66;
	xtrapf = 4.0;
	info = 0;
	infoc = 1;
	siter = MAXITER;


	if (N <= 0 || *stp <= 0.0 || ftol < 0.0 || gtol < 0.0 || xtol < 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}


	for (i = 0; i < N; ++i) {
		nlen += dx[i] * s[i] * dx[i] * s[i];
	}
	nlen = sqrt(nlen);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) > 1.0 / fabs(dx[i])) {
			den = fabs(x[i]);
		}
		else {
			den = 1.0 / fabs(dx[i]);
		}
		rcheck[i] = s[i] / den;
	}

	rell = array_max_abs(rcheck, N);

	stepmin = ftol / rell;

	dginit = 0.0;

	for (j = 0; j < N; ++j) {
		dginit += g[j] * s[j];
	}

	if (dginit >= 0.0) {
		free(rcheck);
		free(wa);
		return info;
	}

	brackt = 0;
	stage1 = 1;
	finit = *f;
	nfev = 0;
	dgtest = ftol*dginit;
	width = maxstep - stepmin;
	width1 = width / 0.5;

	for (j = 0; j < N; ++j) {
		wa[j] = x[j];
	}

	/*     The variables stx, fx, dgx contain the values of the step, 
     function, and directional derivative at the best step.
     The variables sty, fy, dgy contain the value of the step,
     function, and derivative at the other endpoint of
     the interval of uncertainty.
     The variables stp, f, dg contain the values of the step,
     function, and derivative at the current step.
	*/

	stx = 0.0;
	fx = finit;
	dgx = dginit;
	sty = 0.0;
	fy = finit;
	dgy = dginit;

	// Iteration

	while (info == 0) {

		if (brackt == 1) {
			stmin = pmin(stx, sty);
			stmax = pmax(stx, sty);
		} else {
			stmin = stx;
			stmax = *stp + xtrapf*(*stp - stx);
		}

		*stp = pmax(*stp, stepmin);
		*stp = pmin(*stp, maxstep);

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || nfev >= siter - 1 || infoc == 0 || (brackt == 1 && (stmax - stmin) <= xtol*stmax)) {
			*stp = stx;
		}

		for (j = 0; j < N; ++j) {
			x[j] = wa[j] + *stp * s[j];
		}

		*f = FUNCPT_EVAL(funcpt,x, N);
		if (*f >= DBL_MAX || *f <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(rcheck);
			free(wa);
			return 15;
		}
		if (*f != *f) {
			printf("Program Exiting as the function returns NaN");
			free(rcheck);
			free(wa);
			return 15;
		}
		grad_cd(funcpt,funcgrad, x, N, dx, eps2,g);
		nfev++;


		dg = 0.0;
		for (j = 0; j < N; ++j) {
			dg = dg + g[j]*s[j];
		}	
		ftest1 = finit + *stp * dgtest;

		//       Test for convergence.

		if ((brackt == 1 && (*stp <= stmin || *stp >= stmax)) || infoc == 0) {
			info = 6;
		}

		if (*stp == maxstep && *f <= ftest1 && dg <= dgtest) {
			info = 5;
		}

		if (*stp == stepmin && (*f > ftest1 || dg >= dgtest)) {
			info = 4;
		}

		if (nfev >= siter) {
			info = 3;
		}

		if (brackt == 1 && ((stmax - stmin) <= xtol*stmax)) {
			info = 2;
		}

		if (*f <= ftest1 && fabs(dg) <= gtol*(-dginit)) {
			info = 1;
		}

		if (stage1 == 1 && *f <= ftest1 && dg >= pmin(ftol, gtol)*dginit) {
			stage1 = 0;
		}


		/*
		A modified function is used to predict the step only if
        we have not obtained a step for which the modified
        function has a nonpositive function value and nonnegative
        derivative, and if a lower function value has been
        obtained but the decrease is not sufficient.
		*/
		if (stage1 == 1 && *f <= fx && *f > ftest1) {

			fm = *f - *stp*dgtest;
			fxm = fx - stx*dgtest;
			fym = fy - sty*dgtest;
			dgm = dg - dgtest;
			dgxm = dgx - dgtest;
			dgym = dgy - dgtest;

			infoc = cstep(&stx, &fxm, &dgxm, &sty, &fym, &dgym, stp, &fm, &dgm, &brackt, stmin, stmax);

			fx = fxm + stx*dgtest;
			fy = fym + sty*dgtest;
			dgx = dgxm + dgtest;
			dgy = dgym + dgtest;
		} else {
			
			infoc = cstep(&stx, &fx, &dgx, &sty, &fy, &dgy, stp, f, &dg, &brackt, stmin, stmax);
		}

		if (brackt == 1) {
			if (fabs(sty - stx) >= p66*width1) {
				*stp = stx + p5*(sty - stx);
			}
			width1 = width;
			width = fabs(sty - stx);
		}

	}

	free(rcheck);
	free(wa);

	return info;
}